

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O3

void chrono::geometry::ChBasisToolsBspline::BasisEvaluate
               (int p,int i,double u,ChVectorDynamic<> *knotU,ChVectorDynamic<> *N)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  void *pvVar8;
  double *pdVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  double *pdVar13;
  ulong uVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  uVar4 = (N->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < (long)uVar4) {
    pdVar5 = (N->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    uVar14 = 0xffffffffffffffff;
    if (-2 < p) {
      uVar14 = (ulong)(p + 1) * 8;
    }
    *pdVar5 = 1.0;
    pdVar7 = (double *)operator_new__(uVar14);
    pvVar8 = operator_new__(uVar14);
    if (0 < p) {
      uVar10 = 1;
      pdVar6 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar14 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      pdVar9 = pdVar7;
      do {
        pdVar9 = pdVar9 + 1;
        iVar11 = (i + 1) - (int)uVar10;
        if ((iVar11 < 0) || ((long)uVar14 <= (long)iVar11)) {
LAB_00625131:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        uVar12 = uVar10 + (long)i;
        pdVar7[uVar10] = u - pdVar6[iVar11];
        if (((long)uVar12 < 0) || (uVar14 <= uVar12)) goto LAB_00625131;
        *(double *)((long)pvVar8 + uVar10 * 8) = pdVar6[uVar12] - u;
        auVar15 = ZEXT1664(ZEXT816(0));
        pdVar13 = pdVar9;
        uVar12 = 0;
        do {
          if (uVar4 == uVar12) goto LAB_00625112;
          dVar2 = *pdVar13;
          dVar3 = *(double *)((long)pvVar8 + uVar12 * 8 + 8);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar3;
          uVar1 = uVar12 + 1;
          pdVar13 = pdVar13 + -1;
          auVar16._0_8_ = pdVar5[uVar12] / (dVar3 + dVar2);
          auVar16._8_8_ = 0;
          auVar17 = vfmadd231sd_fma(auVar15._0_16_,auVar16,auVar17);
          pdVar5[uVar12] = auVar17._0_8_;
          dVar2 = dVar2 * auVar16._0_8_;
          auVar15 = ZEXT864((ulong)dVar2);
          uVar12 = uVar1;
        } while (uVar10 != uVar1);
        if (uVar10 == uVar4) goto LAB_00625112;
        pdVar5[uVar10] = dVar2;
        uVar10 = uVar10 + 1;
      } while (uVar10 != p + 1);
    }
    operator_delete__(pdVar7);
    operator_delete__(pvVar8);
    return;
  }
LAB_00625112:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

static void BasisEvaluate(const int p,                     ///< order
                              const int i,                     ///< knot span, assume aready computed via FindSpan()
                              const double u,                  ///< parameter
                              const ChVectorDynamic<>& knotU,  ///< knot vector
                              ChVectorDynamic<>& N  ///< here return basis functions N evaluated at u, that is: N(u)
    ) {
        N(0) = 1.0;

        int j, r;
        double* left = new double[p + 1];
        double* right = new double[p + 1];
        double saved, temp;

        for (j = 1; j <= p; ++j) {
            left[j] = u - knotU(i + 1 - j);
            right[j] = knotU(i + j) - u;
            saved = 0.0;
            for (r = 0; r < j; ++r) {
                temp = N(r) / (right[r + 1] + left[j - r]);
                N(r) = saved + right[r + 1] * temp;
                saved = left[j - r] * temp;
            }
            N(j) = saved;
        }

        delete[] left;
        delete[] right;
    }